

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.h
# Opt level: O0

int __thiscall
fmt::v11::basic_string_view<char>::compare
          (basic_string_view<char> *this,basic_string_view<char> other)

{
  unsigned_long in_RDX;
  char *in_RDI;
  int result;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  int local_4;
  
  min_of<unsigned_long>(*(unsigned_long *)(in_RDI + 8),in_RDX);
  local_4 = detail::compare<char>
                      (in_RDI,(char *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                       0x2532af);
  if (local_4 == 0) {
    if (*(unsigned_long *)(in_RDI + 8) == in_RDX) {
      local_4 = 0;
    }
    else {
      local_4 = 1;
      if (*(ulong *)(in_RDI + 8) < in_RDX) {
        local_4 = -1;
      }
    }
  }
  return local_4;
}

Assistant:

FMT_CONSTEXPR auto compare(basic_string_view other) const -> int {
    int result =
        detail::compare(data_, other.data_, min_of(size_, other.size_));
    if (result != 0) return result;
    return size_ == other.size_ ? 0 : (size_ < other.size_ ? -1 : 1);
  }